

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

void stream_unget(stream_t *stream,int c)

{
  size_t sVar1;
  int c_local;
  stream_t *stream_local;
  
  if ((c != -1) && (c != -2)) {
    stream->position = stream->position - 1;
    if (c == 10) {
      stream->line = stream->line + -1;
      stream->column = stream->last_column;
    }
    else {
      sVar1 = utf8_check_first((char)c);
      if (sVar1 != 0) {
        stream->column = stream->column + -1;
      }
    }
    if (stream->buffer_pos == 0) {
      __assert_fail("stream->buffer_pos > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/grimm-co[P]killerbeez-utils/jansson/load.c"
                    ,0xe9,"void stream_unget(stream_t *, int)");
    }
    stream->buffer_pos = stream->buffer_pos - 1;
    if (stream->buffer[stream->buffer_pos] != c) {
      __assert_fail("stream->buffer[stream->buffer_pos] == c",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/grimm-co[P]killerbeez-utils/jansson/load.c"
                    ,0xeb,"void stream_unget(stream_t *, int)");
    }
  }
  return;
}

Assistant:

static void stream_unget(stream_t *stream, int c)
{
	if (c == STREAM_STATE_EOF || c == STREAM_STATE_ERROR)
		return;

	stream->position--;
	if (c == '\n') {
		stream->line--;
		stream->column = stream->last_column;
	}
	else if (utf8_check_first(c))
		stream->column--;

	assert(stream->buffer_pos > 0);
	stream->buffer_pos--;
	assert(stream->buffer[stream->buffer_pos] == c);
}